

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::meetAtIndex
          (Vector<wasm::analysis::Bool> *this,Element *meetee,size_t i,Element *elem)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar4 = i + 0x3f;
  if (-1 < (long)i) {
    sVar4 = i;
  }
  p_Var1 = (meetee->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar5 = (ulong)((i & 0x800000000000003f) < 0x8000000000000001);
  uVar6 = 1L << ((byte)i & 0x3f);
  uVar2 = p_Var1[((long)sVar4 >> 6) + uVar5 + 0xffffffffffffffff];
  bVar3 = (bool)((*elem ^ 1U) & (uVar2 >> (i & 0x3f) & 1) != 0);
  if (bVar3 == true) {
    uVar7 = uVar2 | uVar6;
    if (*elem == false) {
      uVar7 = ~uVar6 & uVar2;
    }
    p_Var1[((long)sVar4 >> 6) + uVar5 + 0xffffffffffffffff] = uVar7;
  }
  return bVar3;
}

Assistant:

bool meetAtIndex(Element& meetee,
                   size_t i,
                   const typename L::Element& elem) const noexcept {
    if constexpr (std::is_same_v<typename L::Element, bool>) {
      // The vector<bool> specialization does not expose references to the
      // individual bools because they might be in a bitmap, so we need a
      // workaround.
      bool e = meetee[i];
      if (lattice.meet(e, elem)) {
        meetee[i] = e;
        return true;
      }
      return false;
    } else {
      return lattice.meet(meetee[i], elem);
    }
  }